

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.hpp
# Opt level: O1

void __thiscall dxil_spv::Operation::add_ids(Operation *this,initializer_list<unsigned_int> *args)

{
  Id arg;
  size_type sVar1;
  iterator puVar2;
  long lVar3;
  
  sVar1 = args->_M_len;
  if (sVar1 != 0) {
    puVar2 = args->_M_array;
    lVar3 = 0;
    do {
      arg = *(Id *)((long)puVar2 + lVar3);
      if (arg == 0) {
        __assert_fail("arg != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/ir.hpp"
                      ,0x79,
                      "void dxil_spv::Operation::add_ids(const std::initializer_list<spv::Id> &)");
      }
      add_id(this,arg);
      lVar3 = lVar3 + 4;
    } while (sVar1 << 2 != lVar3);
  }
  return;
}

Assistant:

explicit IDArgument(spv::Id id_)
	    : id(id_)
	{
	}